

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O0

void do_cmd_activate(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *local_18;
  object *obj;
  command *cmd_local;
  
  obj = (object *)cmd;
  _Var1 = player_get_resume_normal_shape(player,(command_conflict *)cmd);
  if (_Var1) {
    wVar2 = cmd_get_item((command *)obj,"item",&local_18,"Activate which item? ",
                         "You have no items to activate.",obj_is_activatable,L'A');
    if (wVar2 == L'\0') {
      _Var1 = obj_can_activate(local_18);
      if (_Var1) {
        _Var1 = use_aux((command *)obj,local_18,USE_TIMEOUT,L'\x1f');
        if (!_Var1) {
          cmd_set_repeat(L'\0');
        }
      }
      else {
        msg("That item is still charging.");
        cmd_set_repeat(L'\0');
      }
    }
    else {
      cmd_set_repeat(L'\0');
    }
  }
  else {
    cmd_set_repeat(L'\0');
  }
  return;
}

Assistant:

void do_cmd_activate(struct command *cmd)
{
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		cmd_set_repeat(0);
		return;
	}

	/* Get an item */
	if (cmd_get_item(cmd, "item", &obj,
			"Activate which item? ",
			"You have no items to activate.",
			obj_is_activatable,
			USE_EQUIP | SHOW_FAIL) != CMD_OK) {
		cmd_set_repeat(0);
		return;
	}

	if (!obj_can_activate(obj)) {
		msg("That item is still charging.");
		cmd_set_repeat(0);
		return;
	}

	/* Disable autorepetition when successful. */
	if (!use_aux(cmd, obj, USE_TIMEOUT, MSG_ACT_ARTIFACT)) {
		cmd_set_repeat(0);
	}
}